

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::print(Matrix *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (this->rows != 0) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      uVar1 = this->cols;
      if (uVar1 != 0) {
        uVar3 = 0;
        do {
          std::ostream::_M_insert<double>(*(double *)((long)this->data + uVar3 * 8 + uVar1 * lVar4))
          ;
          uVar3 = uVar3 + 1;
          uVar1 = this->cols;
        } while (uVar3 < uVar1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar2 < this->rows);
  }
  return this;
}

Assistant:

Matrix* Matrix::print() {
	for (size_t i = 0; i < rows; i++) {
		for (size_t j = 0; j < cols; j++) {
			std::cout << data[i * cols + j];
		}
		std::cout << std::endl;
	}
	return this;
}